

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_188870::testHeaders(string *fn)

{
  char *pcVar1;
  reference pvVar2;
  ostream *this;
  InputExc *e_1;
  MultiPartInputFile file_2;
  InputExc *e_4;
  InputExc *e_3;
  InputExc *e_2;
  float testPAR;
  float diskPAR;
  Box2i *testDispWin;
  Box2i *diskDispWin;
  Header *diskHeader;
  int i_1;
  MultiPartInputFile file;
  MultiPartOutputFile file_1;
  vector<Imf_3_4::TypedAttribute<float>,_std::allocator<Imf_3_4::TypedAttribute<float>_>_> ifa;
  IntAttribute ta_1;
  stringstream ss;
  size_t i;
  vector<Imf_3_4::TypedAttribute<int>,_std::allocator<Imf_3_4::TypedAttribute<int>_>_> ia;
  ChromaticitiesAttribute ca;
  Chromaticities c;
  TimeCodeAttribute ta;
  TimeCode t;
  ArgExc *e;
  bool caught;
  Header hh;
  Header h;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  value_type *in_stack_fffffffffffffa18;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffa20;
  allocator<char> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffa70;
  allocator<char> local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [32];
  Header local_108 [63];
  allocator<char> local_c9;
  string local_c8 [32];
  Channel local_a8 [16];
  Vec2<float> local_98;
  Header local_90 [79];
  allocator<char> local_41;
  string local_40 [32];
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_20;
  
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1c4b7c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  testMultiPartOutputFileForExpectedFailure
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  Imath_3_2::Vec2<float>::Vec2(&local_98,0.0,0.0);
  Imf_3_4::Header::Header(local_90,0x40,0x40,1.0,(Vec2 *)&local_98,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar1 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_a8,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar1,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  testMultiPartOutputFileForExpectedFailure
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pvVar2 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_20,0);
  Imf_3_4::Header::setType((string *)pvVar2);
  pvVar2 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_20,0);
  Imf_3_4::Header::Header(local_108,pvVar2);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  testMultiPartOutputFileForExpectedFailure
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_12a = 0;
  pvVar2 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_20,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  Imf_3_4::Header::setType((string *)pvVar2);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  this = std::operator<<((ostream *)&std::cerr,"Header : unsupported image type passed");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x15e,"void (anonymous namespace)::testHeaders(const std::string &)");
}

Assistant:

void
testHeaders (const std::string& fn)
{
    //
    // In a multipart context the headers must be subject to the following
    // constraints
    // * type must be set and valid
    // * unique names
    //

    vector<Header> headers;

    //
    // expect this to fail - empty header list
    //
    testMultiPartOutputFileForExpectedFailure (
        headers, fn, "Header : empty header list passed");

    //
    // expect this to fail - header has no image attribute type
    //
    Header h;
    h.channels ().insert ("Dummy", Channel ());
    headers.push_back (h);
    testMultiPartOutputFileForExpectedFailure (
        headers, fn, "Header : empty image type passed");

    //
    // expect this to fail - header name duplication
    //
    headers[0].setType (IMF::SCANLINEIMAGE);
    Header hh (headers[0]);
    headers.push_back (hh);
    testMultiPartOutputFileForExpectedFailure (
        headers, fn, "Header: duplicate header names passed");

    //
    // expect this to fail - header has incorrect image attribute type
    //
    bool caught = false;
    try
    {
        headers[0].setType ("invalid image type");
        cerr << "Header : unsupported image type passed" << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc& e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);

    //
    // Write and Read the data off disk and check values
    //
    TimeCode                t (1234567);
    TimeCodeAttribute       ta (t);
    Chromaticities          c;
    ChromaticitiesAttribute ca (c);
    vector<IntAttribute>    ia;
    for (size_t i = 0; i < headers.size (); i++)
    {
        stringstream ss;
        ss << i;
        headers[i].setName (ss.str ());
        headers[i].setType (IMF::SCANLINEIMAGE);
        headers[i].insert (TimeCodeAttribute::staticTypeName (), ta);
        headers[i].insert (ChromaticitiesAttribute::staticTypeName (), ca);

        IntAttribute ta (i);
        ia.push_back (ta);
        headers[i].insert (IntAttribute::staticTypeName (), ta);
    }
    vector<FloatAttribute> ifa;
    ifa.push_back (FloatAttribute (3.14f));
    headers[0].insert (FloatAttribute::staticTypeName (), ifa.back ());

    // write out the file
    remove (fn.c_str ());
    {
        MultiPartOutputFile file (fn.c_str (), &headers[0], headers.size ());
    }

    // read in the file and look at the attribute data
    MultiPartInputFile file (fn.c_str ());

    assert (file.parts () == 2);

    for (int i = 0; i < file.parts (); i++)
    {
        const Header& diskHeader = file.header (i);
        //
        // Test Display Window
        //
        const IMATH_NAMESPACE::Box2i& diskDispWin = diskHeader.displayWindow ();
        const IMATH_NAMESPACE::Box2i& testDispWin = headers[i].displayWindow ();
        assert (diskDispWin == testDispWin);

        //
        // Test Pixel Aspect Ratio
        //
        float diskPAR = diskHeader.pixelAspectRatio ();
        float testPAR = headers[i].pixelAspectRatio ();
        assert (diskPAR == testPAR);

        //
        // Test TimeCode
        //
        try
        {
            testDiskAttrValue<TimeCodeAttribute> (diskHeader, ta);
        }
        catch (const IEX_NAMESPACE::InputExc& e)
        {
            cerr << "Shared Attributes : TimeCode : " << e.what () << endl;
            assert (false);
        }

        //
        // Test Chromaticities
        //
        try
        {
            testDiskAttrValue<ChromaticitiesAttribute> (diskHeader, ca);
        }
        catch (const IEX_NAMESPACE::InputExc& e)
        {
            cerr << "Shared Attributes : Chromaticities : " << e.what ()
                 << endl;
            assert (false);
        }

        //
        // Test for non-shared attribute that can have differing values across
        // multiple parts
        //
        try
        {
            testDiskAttrValue<IntAttribute> (diskHeader, ia[i]);
        }
        catch (const IEX_NAMESPACE::InputExc& e)
        {
            cerr << "Shared Attributes : IntAttribute : " << e.what () << endl;
            assert (false);
        }
    }

    //
    // Test the code against an incorrectly constructed file
    //
    try
    {
        caught = false;
        MultiPartInputFile file (ILM_IMF_TEST_IMAGEDIR
                                 "invalid_shared_attrs_multipart.exr");
        cerr << "Shared Attributes : InputFile : incorrect input file passed\n";
        assert (false);
    }
    catch (const IEX_NAMESPACE::InputExc& e)
    {
        // expectected behaviour
        caught = true;
    }
    assert (caught);
}